

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

agr * __thiscall
agr::except_error_func<std::out_of_range>(agr *this,string *beg,string *var,string *end)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
      ::oss_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                                 ::oss_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)
                 &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                  ::oss_abi_cxx11_);
      __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                   &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                    ::oss_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                           ::oss_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_68,"",(allocator<char> *)&local_48);
  std::__cxx11::stringbuf::str((string *)&DAT_0014a550);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::ios::clear((int)*(undefined8 *)
                        (except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                         ::oss_abi_cxx11_ + -0x18) + 0x14a548);
  poVar2 = std::operator<<((ostream *)
                           &except_error_func<std::out_of_range>(std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string_const&)
                            ::oss_abi_cxx11_,"\x1b[31m");
  poVar2 = std::operator<<(poVar2,(string *)beg);
  s_abi_cxx11_(&bStack_68," \"",2);
  poVar2 = std::operator<<(poVar2,(string *)&bStack_68);
  poVar2 = std::operator<<(poVar2,"\x1b[1m");
  poVar2 = std::operator<<(poVar2,(string *)var);
  poVar2 = std::operator<<(poVar2,"\x1b[22m");
  s_abi_cxx11_(&local_48,"\" ",2);
  poVar2 = std::operator<<(poVar2,(string *)&local_48);
  poVar2 = std::operator<<(poVar2,(string *)end);
  std::operator<<(poVar2,"\x1b[39m");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::stringbuf::str();
  std::out_of_range::out_of_range((out_of_range *)this,(string *)&bStack_68);
  std::__cxx11::string::~string((string *)&bStack_68);
  return this;
}

Assistant:

inline T_err except_error_func( const std::string& beg = "", std::string var = nullptr, const std::string& end = "" )
   {
    using namespace std::literals::string_literals;

    static std::ostringstream oss;
    oss.str( "" );
    oss.clear();
    oss << "\033[31m" << beg << " \""s << "\033[1m" << var << "\033[22m" << "\" "s << end << "\033[39m";

    return T_err( oss.str() ); 
   }